

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O0

void Ssw_ManRefineByFilterSim(Ssw_Man_t *p,int nFrames)

{
  Vec_Ptr_t *p_00;
  uint *p_01;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  int RetValue2;
  int RetValue1;
  int i;
  int f;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  int nFrames_local;
  Ssw_Man_t *p_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswFilter.c"
                  ,0x32,"void Ssw_ManRefineByFilterSim(Ssw_Man_t *, int)");
  }
  for (RetValue2 = 0; iVar3 = Saig_ManRegNum(p->pAig), RetValue2 < iVar3; RetValue2 = RetValue2 + 1)
  {
    p_00 = p->pAig->vCos;
    iVar3 = Saig_ManPoNum(p->pAig);
    pvVar6 = Vec_PtrEntry(p_00,RetValue2 + iVar3);
    p_01 = p->pPatWords;
    iVar3 = Saig_ManPiNum(p->pAig);
    uVar5 = Abc_InfoHasBit(p_01,iVar3 + RetValue2);
    *(ulong *)((long)pvVar6 + 0x18) =
         *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar5 & 1) << 5;
  }
  for (RetValue1 = 0; RetValue1 < nFrames; RetValue1 = RetValue1 + 1) {
    pAVar7 = Aig_ManConst1(p->pAig);
    *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf | 0x20;
    for (RetValue2 = 0; iVar3 = Saig_ManPiNum(p->pAig), RetValue2 < iVar3; RetValue2 = RetValue2 + 1
        ) {
      pvVar6 = Vec_PtrEntry(p->pAig->vCis,RetValue2);
      *(ulong *)((long)pvVar6 + 0x18) = *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffdf;
    }
    for (RetValue2 = 0; iVar3 = Saig_ManRegNum(p->pAig), RetValue2 < iVar3;
        RetValue2 = RetValue2 + 1) {
      pAVar7 = Saig_ManLi(p->pAig,RetValue2);
      pAVar8 = Saig_ManLo(p->pAig,RetValue2);
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar7->field_0x18 >> 5) & 1) << 5;
    }
    for (RetValue2 = 0; iVar3 = Vec_PtrSize(p->pAig->vObjs), RetValue2 < iVar3;
        RetValue2 = RetValue2 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,RetValue2);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar7), iVar3 != 0)) {
        pAVar8 = Aig_ObjFanin0(pAVar7);
        uVar2 = *(ulong *)&pAVar8->field_0x18;
        uVar5 = Aig_ObjFaninC0(pAVar7);
        pAVar8 = Aig_ObjFanin1(pAVar7);
        uVar1 = *(ulong *)&pAVar8->field_0x18;
        uVar4 = Aig_ObjFaninC1(pAVar7);
        *(ulong *)&pAVar7->field_0x18 =
             *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar2 >> 5) & 1 ^ uVar5) & ((uint)(uVar1 >> 5) & 1 ^ uVar4)) & 1) << 5
        ;
      }
    }
    for (RetValue2 = 0; iVar3 = Vec_PtrSize(p->pAig->vCos), RetValue2 < iVar3;
        RetValue2 = RetValue2 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,RetValue2);
      pAVar8 = Aig_ObjFanin0(pAVar7);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar7);
      *(ulong *)&pAVar7->field_0x18 =
           *(ulong *)&pAVar7->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar2 >> 5) & 1 ^ uVar5) & 1) << 5;
    }
    if (RetValue1 == 0) {
      for (RetValue2 = 0; iVar3 = Vec_PtrSize(p->pAig->vObjs), RetValue2 < iVar3;
          RetValue2 = RetValue2 + 1) {
        pvVar6 = Vec_PtrEntry(p->pAig->vObjs,RetValue2);
        if (pvVar6 != (void *)0x0) {
          *(ulong *)((long)pvVar6 + 0x18) =
               *(ulong *)((long)pvVar6 + 0x18) & 0xfffffffffffffff7 |
               (ulong)((uint)(*(ulong *)((long)pvVar6 + 0x18) >> 5) & 1) << 3;
        }
      }
    }
    else {
      Ssw_ClassesRefineConst1(p->ppClasses,0);
      Ssw_ClassesRefine(p->ppClasses,0);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs fraiging for one node.]

  Description [Returns the fraiged node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManRefineByFilterSim( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, RetValue1, RetValue2;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
}